

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void gen_spr_40x(CPUPPCState_conflict2 *env)

{
  _spr_register(env,0x3fa,"DCCR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3fb,"ICCR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3d3,"ICDBDR",spr_noaccess,spr_noaccess,spr_read_generic,spr_noaccess,
                spr_read_generic,spr_noaccess,0);
  _spr_register(env,0x3d5,"DEAR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3d4,"ESR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3d6,"EVPR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_excp_prefix,
                spr_read_generic,spr_write_excp_prefix,0);
  _spr_register(env,0x3de,"SRR2",spr_read_generic,spr_write_generic,spr_read_generic,
                spr_write_generic,spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3df,"SRR3",spr_read_generic,spr_write_generic,spr_read_generic,
                spr_write_generic,spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3db,"PIT",spr_noaccess,spr_noaccess,spr_read_40x_pit,spr_write_40x_pit,
                spr_read_40x_pit,spr_write_40x_pit,0);
  _spr_register(env,0x3da,"TCR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_booke_tcr,
                spr_read_generic,spr_write_booke_tcr,0);
  _spr_register(env,0x3d8,"TSR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_booke_tsr,
                spr_read_generic,spr_write_booke_tsr,0);
  return;
}

Assistant:

static void gen_spr_40x(CPUPPCState *env)
{
    /* Cache */
    /* not emulated, as QEMU do not emulate caches */
    spr_register(env, SPR_40x_DCCR, "DCCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* not emulated, as QEMU do not emulate caches */
    spr_register(env, SPR_40x_ICCR, "ICCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* not emulated, as QEMU do not emulate caches */
    spr_register(env, SPR_BOOKE_ICDBDR, "ICDBDR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, SPR_NOACCESS,
                 0x00000000);
    /* Exception */
    spr_register(env, SPR_40x_DEAR, "DEAR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_40x_ESR, "ESR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_40x_EVPR, "EVPR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_excp_prefix,
                 0x00000000);
    spr_register(env, SPR_40x_SRR2, "SRR2",
                 &spr_read_generic, &spr_write_generic,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_40x_SRR3, "SRR3",
                 &spr_read_generic, &spr_write_generic,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Timers */
    spr_register(env, SPR_40x_PIT, "PIT",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_40x_pit, &spr_write_40x_pit,
                 0x00000000);
    spr_register(env, SPR_40x_TCR, "TCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_booke_tcr,
                 0x00000000);
    spr_register(env, SPR_40x_TSR, "TSR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_booke_tsr,
                 0x00000000);
}